

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

void __thiscall QStyleSheetStyle::QStyleSheetStyle(QStyleSheetStyle *this,QStyle *base)

{
  int iVar1;
  QWindowsStylePrivate *this_00;
  QStyleSheetStyleCaches *this_01;
  bool bVar2;
  
  this_00 = (QWindowsStylePrivate *)operator_new(0x158);
  QWindowsStylePrivate::QWindowsStylePrivate(this_00);
  *(undefined ***)&(this_00->super_QCommonStylePrivate).super_QStylePrivate =
       &PTR__QWindowsStylePrivate_007ea328;
  QWindowsStyle::QWindowsStyle((QWindowsStyle *)this,this_00);
  *(undefined ***)this = &PTR_metaObject_007ea038;
  *(QStyle **)(this + 0x10) = base;
  *(undefined4 *)(this + 0x18) = 1;
  QCss::Parser::Parser((Parser *)(this + 0x20));
  iVar1 = numinstances + 1;
  bVar2 = numinstances == 0;
  numinstances = iVar1;
  if (bVar2) {
    this_01 = (QStyleSheetStyleCaches *)operator_new(0x48);
    QObject::QObject((QObject *)this_01,(QObject *)0x0);
    *(undefined ***)this_01 = &PTR_metaObject_007ea200;
    (this_01->styleRulesCache).d = (Data *)0x0;
    (this_01->hasStyleRuleCache).d = (Data *)0x0;
    (this_01->renderRulesCache).d = (Data *)0x0;
    (this_01->styleSheetCache).d = (Data *)0x0;
    (this_01->autoFillDisabledWidgets).q_hash.d = (Data *)0x0;
    (this_01->customPaletteWidgets).d = (Data *)0x0;
    (this_01->customFontWidgets).d = (Data *)0x0;
    styleSheetCaches = this_01;
  }
  return;
}

Assistant:

QStyleSheetStyle::QStyleSheetStyle(QStyle *base)
    : QWindowsStyle(*new QStyleSheetStylePrivate), base(base), refcount(1)
{
    ++numinstances;
    if (numinstances == 1) {
        styleSheetCaches = new QStyleSheetStyleCaches;
    }
}